

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.h
# Opt level: O2

void __thiscall Am_Assoc_Data::Am_Assoc_Data(Am_Assoc_Data *this,Am_Assoc_Data *proto)

{
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb228;
  (this->value_1).type = 0;
  (this->value_1).value.wrapper_value = (Am_Wrapper *)0x0;
  (this->value_2).type = 0;
  (this->value_2).value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value::operator=(&this->value_1,&proto->value_1);
  Am_Value::operator=(&this->value_2,&proto->value_2);
  return;
}

Assistant:

Am_Assoc_Data(Am_Assoc_Data *proto) //required by wrapper
  {
    value_1 = proto->value_1;
    value_2 = proto->value_2;
  }